

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O2

void __thiscall lsim::SimCircuit::build_name(SimCircuit *this,uint32_t comp_id)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  std::__cxx11::string::_M_assign((string *)&this->m_name);
  std::__cxx11::to_string(&local_38,comp_id);
  std::operator+(&bStack_58,"#",&local_38);
  std::__cxx11::string::append((string *)&this->m_name);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void SimCircuit::build_name(uint32_t comp_id) {
    m_name = m_circuit_desc->name();
    m_name += "#" + std::to_string(comp_id);
}